

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_lpf_uninit(ma_lpf *pLPF,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_lpf1 *pmVar1;
  ma_lpf2 *pmVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  if (pLPF != (ma_lpf *)0x0) {
    uVar3 = pLPF->lpf1Count;
    if (uVar3 != 0) {
      lVar5 = 0x20;
      uVar4 = 0;
      do {
        pmVar1 = pLPF->pLPF1;
        if ((pmVar1 != (ma_lpf1 *)0x0) && (*(int *)((long)&pmVar1->format + lVar5) != 0)) {
          ma_free(*(void **)((long)pmVar1 + lVar5 + -8),pAllocationCallbacks);
          uVar3 = pLPF->lpf1Count;
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x28;
      } while (uVar4 < uVar3);
    }
    uVar3 = pLPF->lpf2Count;
    if (uVar3 != 0) {
      lVar5 = 0x38;
      uVar4 = 0;
      do {
        pmVar2 = pLPF->pLPF2;
        if ((pmVar2 != (ma_lpf2 *)0x0) && (*(int *)((long)&(pmVar2->bq).format + lVar5) != 0)) {
          ma_free(*(void **)((long)pmVar2 + lVar5 + -8),pAllocationCallbacks);
          uVar3 = pLPF->lpf2Count;
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x40;
      } while (uVar4 < uVar3);
    }
    if (pLPF->_ownsHeap != 0) {
      ma_free(pLPF->_pHeap,pAllocationCallbacks);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_lpf_uninit(ma_lpf* pLPF, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_uint32 ilpf1;
    ma_uint32 ilpf2;

    if (pLPF == NULL) {
        return;
    }

    for (ilpf1 = 0; ilpf1 < pLPF->lpf1Count; ilpf1 += 1) {
        ma_lpf1_uninit(&pLPF->pLPF1[ilpf1], pAllocationCallbacks);
    }

    for (ilpf2 = 0; ilpf2 < pLPF->lpf2Count; ilpf2 += 1) {
        ma_lpf2_uninit(&pLPF->pLPF2[ilpf2], pAllocationCallbacks);
    }

    if (pLPF->_ownsHeap) {
        ma_free(pLPF->_pHeap, pAllocationCallbacks);
    }
}